

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<int,unsigned_int,unsigned_int>
          (InternalException *this,string *msg,int params,uint params_1,uint params_2)

{
  undefined4 in_register_00000014;
  uint in_R9D;
  string local_30;
  
  Exception::ConstructMessage<int,unsigned_int,unsigned_int>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),params_1,
             params_2,in_R9D);
  InternalException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}